

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printf.cpp
# Opt level: O3

unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>,_true> __thiscall
duckdb::BindPrintfFunction
          (duckdb *this,ClientContext *context,ScalarFunction *bound_function,
          vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
          *arguments)

{
  reference this_00;
  pointer pEVar1;
  LogicalTypeId *__args;
  size_type __n;
  vector<duckdb::LogicalType,_true> *this_01;
  LogicalType local_48;
  
  if (8 < (ulong)((long)(arguments->
                        super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                        ).
                        super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish -
                 (long)(arguments->
                       super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                       ).
                       super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                       ._M_impl.super__Vector_impl_data._M_start)) {
    this_01 = &(bound_function->super_BaseScalarFunction).super_SimpleFunction.arguments;
    __n = 1;
    do {
      this_00 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
                ::operator[](arguments,__n);
      pEVar1 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
               operator->(this_00);
      switch((pEVar1->return_type).id_) {
      case UNKNOWN:
        __args = &LogicalType::ANY;
        break;
      default:
        __args = &LogicalType::VARCHAR;
        break;
      case BOOLEAN:
        __args = &LogicalType::BOOLEAN;
        break;
      case TINYINT:
      case SMALLINT:
      case INTEGER:
      case BIGINT:
        __args = &LogicalType::BIGINT;
        break;
      case DECIMAL:
      case FLOAT:
      case DOUBLE:
        __args = &LogicalType::DOUBLE;
        break;
      case VARCHAR:
        LogicalType::LogicalType(&local_48,VARCHAR);
        ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::
        emplace_back<duckdb::LogicalType>
                  ((vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)this_01,
                   &local_48);
        LogicalType::~LogicalType(&local_48);
        goto LAB_0103252c;
      case UTINYINT:
      case USMALLINT:
      case UINTEGER:
      case UBIGINT:
        __args = &LogicalType::UBIGINT;
      }
      ::std::vector<duckdb::LogicalType,std::allocator<duckdb::LogicalType>>::
      emplace_back<duckdb::LogicalTypeId_const&>
                ((vector<duckdb::LogicalType,std::allocator<duckdb::LogicalType>> *)this_01,__args);
LAB_0103252c:
      __n = __n + 1;
    } while (__n < (ulong)((long)(arguments->
                                 super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                                 ).
                                 super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                                 ._M_impl.super__Vector_impl_data._M_finish -
                           (long)(arguments->
                                 super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                                 ).
                                 super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start >> 3));
  }
  *(undefined8 *)this = 0;
  return (unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_>)
         (unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_>)this;
}

Assistant:

unique_ptr<FunctionData> BindPrintfFunction(ClientContext &context, ScalarFunction &bound_function,
                                            vector<unique_ptr<Expression>> &arguments) {
	for (idx_t i = 1; i < arguments.size(); i++) {
		switch (arguments[i]->return_type.id()) {
		case LogicalTypeId::BOOLEAN:
			bound_function.arguments.emplace_back(LogicalType::BOOLEAN);
			break;
		case LogicalTypeId::TINYINT:
		case LogicalTypeId::SMALLINT:
		case LogicalTypeId::INTEGER:
		case LogicalTypeId::BIGINT:
			bound_function.arguments.emplace_back(LogicalType::BIGINT);
			break;
		case LogicalTypeId::UTINYINT:
		case LogicalTypeId::USMALLINT:
		case LogicalTypeId::UINTEGER:
		case LogicalTypeId::UBIGINT:
			bound_function.arguments.emplace_back(LogicalType::UBIGINT);
			break;
		case LogicalTypeId::FLOAT:
		case LogicalTypeId::DOUBLE:
			bound_function.arguments.emplace_back(LogicalType::DOUBLE);
			break;
		case LogicalTypeId::VARCHAR:
			bound_function.arguments.push_back(LogicalType::VARCHAR);
			break;
		case LogicalTypeId::DECIMAL:
			// decimal type: add cast to double
			bound_function.arguments.emplace_back(LogicalType::DOUBLE);
			break;
		case LogicalTypeId::UNKNOWN:
			// parameter: accept any input and rebind later
			bound_function.arguments.emplace_back(LogicalType::ANY);
			break;
		default:
			// all other types: add cast to string
			bound_function.arguments.emplace_back(LogicalType::VARCHAR);
			break;
		}
	}
	return nullptr;
}